

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O0

int re_forwsrch(void)

{
  int iVar1;
  char *local_30;
  line *local_28;
  line *clp;
  int local_18;
  int error;
  int tdotline;
  int tbo;
  int re_flags;
  
  local_28 = curwp->w_dotp;
  error = curwp->w_doto;
  local_18 = curwp->w_dotline;
  if (((error == local_28->l_used) && (local_28 != curbp->b_headp)) && (local_28->l_used != 0)) {
    local_28 = local_28->l_fp;
    local_18 = local_18 + 1;
    error = 0;
  }
  while( true ) {
    if (local_28 == curbp->b_headp) {
      return 0;
    }
    tdotline = 4;
    if (error != 0) {
      tdotline = 5;
    }
    regex_match[0].rm_so = error;
    regex_match[0].rm_eo = local_28->l_used;
    if (local_28->l_text == (char *)0x0) {
      local_30 = "";
    }
    else {
      local_30 = local_28->l_text;
    }
    iVar1 = regexec((regex_t *)&regex_buff,local_30,10,(regmatch_t *)regex_match,tdotline);
    if (iVar1 == 0) break;
    local_28 = local_28->l_fp;
    local_18 = local_18 + 1;
    error = 0;
  }
  curwp->w_doto = regex_match[0].rm_eo;
  curwp->w_dotp = local_28;
  curwp->w_dotline = local_18;
  curwp->w_rflag = curwp->w_rflag | 2;
  return 1;
}

Assistant:

static int
re_forwsrch(void)
{
	int	 	 re_flags, tbo, tdotline, error;
	struct line	*clp;

	clp = curwp->w_dotp;
	tbo = curwp->w_doto;
	tdotline = curwp->w_dotline;

	if (tbo == clp->l_used)
		/*
		 * Don't start matching past end of line -- must move to
		 * beginning of next line, unless line is empty or at
		 * end of file.
		 */
		if (clp != curbp->b_headp && llength(clp) != 0) {
			clp = lforw(clp);
			tdotline++;
			tbo = 0;
		}
	/*
	 * Note this loop does not process the last line, but this editor
	 * always makes the last line empty so this is good.
	 */
	while (clp != (curbp->b_headp)) {
		re_flags = REG_STARTEND;
		if (tbo != 0)
			re_flags |= REG_NOTBOL;
		regex_match[0].rm_so = tbo;
		regex_match[0].rm_eo = llength(clp);
		error = regexec(&regex_buff, ltext(clp) ? ltext(clp) : "",
		    RE_NMATCH, regex_match, re_flags);
		if (error != 0) {
			clp = lforw(clp);
			tdotline++;
			tbo = 0;
		} else {
			curwp->w_doto = regex_match[0].rm_eo;
			curwp->w_dotp = clp;
			curwp->w_dotline = tdotline;
			curwp->w_rflag |= WFMOVE;
			return (TRUE);
		}
	}
	return (FALSE);
}